

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall AGSSock::Pool::run(Pool *this)

{
  uint *puVar1;
  Socket *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  reference ppSVar6;
  ssize_t sVar7;
  int *piVar8;
  _Node_iterator<AGSSock::Socket_*,_true,_false> __position;
  int iVar9;
  _Node_iterator_base<AGSSock::Socket_*,_false> *__y;
  int error;
  int ret;
  char buffer [65536];
  Socket *sock_1;
  _Node_iterator_base<AGSSock::Socket_*,_false> local_f0;
  iterator it;
  Lock local_d8;
  Lock lock_1;
  Socket *sock;
  iterator __end3;
  iterator __begin3;
  Sockets *__range3;
  Lock lock;
  fd_set *__arr;
  uint __i;
  int nfds;
  fd_set read;
  int signal;
  Pool *this_local;
  
  read.fds_bits[0xf]._4_4_ = AGSSockAPI::Beacon::operator_cast_to_int(&this->beacon_);
  puts("\t\tThread started");
  do {
    lock.mutex_ = (Mutex *)&__i;
    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
      puVar1 = (uint *)((long)&(lock.mutex_)->mutex + (ulong)(uint)__arr * 8);
      puVar1[0] = 0;
      puVar1[1] = 0;
    }
    *(ulong *)(&__i + (long)(read.fds_bits[0xf]._4_4_ / 0x40) * 2) =
         1L << ((byte)((long)read.fds_bits[0xf]._4_4_ % 0x40) & 0x3f) |
         *(ulong *)(&__i + (long)(read.fds_bits[0xf]._4_4_ / 0x40) * 2);
    __arr._4_4_ = read.fds_bits[0xf]._4_4_;
    AGSSockAPI::Mutex::Lock::Lock((Lock *)&__range3,&this->guard_);
    __end3 = std::
             unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
             ::begin(&this->sockets_);
    sock = (Socket *)
           std::
           unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
           ::end(&this->sockets_);
    while (bVar3 = std::__detail::operator!=
                             (&__end3.super__Node_iterator_base<AGSSock::Socket_*,_false>,
                              (_Node_iterator_base<AGSSock::Socket_*,_false> *)&sock), bVar3) {
      ppSVar6 = std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator*(&__end3);
      lock_1.mutex_ = (Mutex *)*ppSVar6;
      lVar5 = (long)(((Socket *)lock_1.mutex_)->id / 0x40);
      *(ulong *)(&__i + lVar5 * 2) =
           1L << ((byte)((long)((Socket *)lock_1.mutex_)->id % 0x40) & 0x3f) |
           *(ulong *)(&__i + lVar5 * 2);
      if (__arr._4_4_ < ((Socket *)lock_1.mutex_)->id) {
        __arr._4_4_ = ((Socket *)lock_1.mutex_)->id;
      }
      std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator++(&__end3);
    }
    AGSSockAPI::Mutex::Lock::~Lock((Lock *)&__range3);
    select(__arr._4_4_ + 1,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    AGSSockAPI::Mutex::Lock::Lock(&local_d8,&this->guard_);
    if ((*(ulong *)(&__i + (long)(read.fds_bits[0xf]._4_4_ / 0x40) * 2) &
        1L << ((byte)((long)read.fds_bits[0xf]._4_4_ % 0x40) & 0x3f)) != 0) {
      AGSSockAPI::Beacon::reset(&this->beacon_);
      read.fds_bits[0xf]._4_4_ = AGSSockAPI::Beacon::operator_cast_to_int(&this->beacon_);
      puts("\t\tThread signalled");
    }
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
         ::begin(&this->sockets_);
    while( true ) {
      sock_1 = (Socket *)
               std::
               unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
               ::end(&this->sockets_);
      __y = (_Node_iterator_base<AGSSock::Socket_*,_false> *)&sock_1;
      bVar3 = std::__detail::operator!=(&local_f0,__y);
      iVar9 = (int)__y;
      if (!bVar3) break;
      ppSVar6 = std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator*
                          ((_Node_iterator<AGSSock::Socket_*,_true,_false> *)&local_f0);
      pSVar2 = *ppSVar6;
      if ((*(ulong *)(&__i + (long)(pSVar2->id / 0x40) * 2) &
          1L << ((byte)((long)pSVar2->id % 0x40) & 0x3f)) == 0) {
LAB_00118f5d:
        std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator++
                  ((_Node_iterator<AGSSock::Socket_*,_true,_false> *)&local_f0);
      }
      else {
        sVar7 = recv(pSVar2->id,&error,0x10000,0);
        iVar4 = (int)sVar7;
        piVar8 = __errno_location();
        iVar9 = *piVar8;
        if ((iVar4 == -1) && ((iVar9 == 0xb || (iVar9 == 0xb)))) {
          std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator++
                    ((_Node_iterator<AGSSock::Socket_*,_true,_false> *)&local_f0);
        }
        else {
          if (iVar4 == -1) {
            (pSVar2->incoming).error = iVar9;
          }
          else if (pSVar2->type == 1) {
            Buffer::append(&pSVar2->incoming,(char *)&error,(long)iVar4);
          }
          else {
            Buffer::push(&pSVar2->incoming,(char *)&error,(long)iVar4);
          }
          if ((iVar4 != -1) && ((iVar4 != 0 || (pSVar2->type != 1)))) goto LAB_00118f5d;
          __position = std::__detail::_Node_iterator<AGSSock::Socket_*,_true,_false>::operator++
                                 ((_Node_iterator<AGSSock::Socket_*,_true,_false> *)&local_f0,0);
          std::
          unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
          ::erase(&this->sockets_,
                  (iterator)__position.super__Node_iterator_base<AGSSock::Socket_*,_false>._M_cur);
        }
      }
    }
    bVar3 = std::
            unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
            ::empty(&this->sockets_);
    if (bVar3) {
      puts("\t\tThread finished");
      AGSSockAPI::Thread::exit(&this->thread_,iVar9);
    }
    AGSSockAPI::Mutex::Lock::~Lock(&local_d8);
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void Pool::run()
{
	SOCKET signal = beacon_;
	fd_set read;
	int nfds;
	
	DEBUG_P("Thread started");
	for (;;) { /* event loop */
	
	// Reset FD sets
	FD_ZERO(&read);
	FD_SET(signal, &read);
	nfds = signal;
	
	// Add pool sockets to FD sets
	{
		Mutex::Lock lock(guard_);
		
		for (Socket *sock : sockets_)
		{
			FD_SET(sock->id, &read);
			// Windows ignores the nfds parameter, skip for efficiency
		#ifndef _WIN32
			if (nfds < sock->id)
				nfds = sock->id;
		#endif
		}
	}
	
	// Wait for events
	select(nfds + 1, &read, nullptr, nullptr, nullptr);
	// If select errs a socket was most likely closed locally, this is fine.
	// We need to check which one(s) and ignore all 'would block's.
	
	// Process read and error events
	{
		Mutex::Lock lock(guard_);
		
		if (FD_ISSET(signal, &read))
		{
			beacon_.reset();
			signal = beacon_;
			DEBUG_P("Thread signalled");
		}

		for (Sockets::iterator it = sockets_.begin(); it != sockets_.end();)
		{
			Socket *sock = *it;

			if (FD_ISSET(sock->id, &read))
			{
				char buffer[65536];
				int ret = recv(sock->id, buffer, sizeof (buffer), 0);
				int error = GET_ERROR();
				
				// We ignore sockets that would block:
				// This is normally filtered by select but a signal could have
				// interrupted select.
				if (ret == SOCKET_ERROR && WOULD_BLOCK(error))
				{
					++it;
					continue;
				}
				
				// If ret == 0 then closed gracefully (for TCP)
				// If ret == SOCKET_ERROR probably closed not so gracefully
				
				if (ret == SOCKET_ERROR)
					sock->incoming.error = error;
				else if (sock->type == SOCK_STREAM)
					sock->incoming.append(buffer, ret);
				else
					sock->incoming.push(buffer, ret);
				
				if ((ret == SOCKET_ERROR)
					|| (!ret && sock->type == SOCK_STREAM))
				{
					// This socket is done for, stop reading
					sockets_.erase(it++);
					continue;
				}	
			}

			++it;
		}
		
		// Close thread if there are no sockets to process anymore
		// Note: This is safe because the thread will be (re)started when
		//       sockets are added to the pool which requires the pool lock.
		if (sockets_.empty())
		{
			DEBUG_P("Thread finished");
			thread_.exit();
			return;
		}
	}
	
	} /* event loop */
	
	// Note: chaining the two critical sections might be more efficient as it
	// merges the loops, but this is not worth the hassle and might introduce
	// errors.
	
	DEBUG_P("Thread cancelled");
	thread_.exit();
	return;
}